

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O2

void Abc_ResStartPart2(int nInputs,uint *uParts,int nParts)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = 0;
  uVar4 = 0;
  if (0 < nParts) {
    uVar4 = (ulong)(uint)nParts;
  }
  for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    uParts[uVar1] = 0;
  }
  iVar2 = 0;
  iVar3 = 0;
  if (0 < nInputs) {
    iVar3 = nInputs;
  }
  for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
    uParts[(long)iVar2 % (long)nParts & 0xffffffff] =
         uParts[(long)iVar2 % (long)nParts & 0xffffffff] | 1 << ((byte)iVar2 & 0x1f);
  }
  iVar3 = 0;
  for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    iVar2 = Extra_WordCountOnes(uParts[uVar1]);
    iVar3 = iVar3 + iVar2;
  }
  if (iVar3 != nInputs) {
    __assert_fail("Count == nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x9e,"void Abc_ResStartPart2(int, unsigned int *, int)");
  }
  return;
}

Assistant:

void Abc_ResStartPart2( int nInputs, unsigned uParts[], int nParts )
{
    int i, Count = 0;
    for ( i = 0; i < nParts; i++ )
        uParts[i] = 0;
    for ( i = 0; i < nInputs; i++ )
        uParts[i % nParts] |= (1 << i);
    for ( i = 0; i < nParts; i++ )
        Count += Extra_WordCountOnes( uParts[i] );
    assert( Count == nInputs );
}